

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O0

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  int iVar1;
  size_t len_local;
  char *data_local;
  upb_MdEnumDecoder *decoder_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar1 == 0) {
    decoder_local = (upb_MdEnumDecoder *)upb_MtDecoder_DoBuildMiniTableEnum(decoder,data,len);
  }
  else {
    decoder_local = (upb_MdEnumDecoder *)0x0;
  }
  return (upb_MiniTableEnum *)decoder_local;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}